

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_text.cpp
# Opt level: O0

char * __thiscall
flatbuffers::JsonPrinter::GenStruct(JsonPrinter *this,StructDef *struct_def,Table *table,int indent)

{
  FieldDef *fd_00;
  bool bVar1;
  int iVar2;
  reference ppFVar3;
  char *pcVar4;
  byte local_7a;
  bool local_79;
  char *err;
  bool output_anyway;
  bool is_present;
  FieldDef *fd;
  __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
  local_48;
  const_iterator it;
  Table *pTStack_38;
  int elem_indent;
  uint8_t *prev_val;
  int fieldout;
  int indent_local;
  Table *table_local;
  StructDef *struct_def_local;
  JsonPrinter *this_local;
  
  std::__cxx11::string::operator+=((string *)this->text,'{');
  prev_val._0_4_ = 0;
  pTStack_38 = (Table *)0x0;
  iVar2 = Indent(this);
  it._M_current._4_4_ = indent + iVar2;
  local_48._M_current =
       (FieldDef **)
       std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::begin
                 (&(struct_def->fields).vec);
  do {
    fd = (FieldDef *)
         std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::end
                   (&(struct_def->fields).vec);
    bVar1 = __gnu_cxx::operator!=
                      (&local_48,
                       (__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                        *)&fd);
    if (!bVar1) {
      AddNewLine(this);
      AddIndent(this,indent);
      std::__cxx11::string::operator+=((string *)this->text,'}');
      return (char *)0x0;
    }
    ppFVar3 = __gnu_cxx::
              __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
              ::operator*(&local_48);
    fd_00 = *ppFVar3;
    local_79 = true;
    if ((struct_def->fixed & 1U) == 0) {
      local_79 = Table::CheckField(table,(fd_00->value).offset);
    }
    if (((this->opts->output_default_scalars_in_json & 1U) != 0) ||
       (local_7a = 0, (fd_00->key & 1U) != 0)) {
      bVar1 = IsScalar((fd_00->value).type.base_type);
      local_7a = 0;
      if (bVar1) {
        local_7a = fd_00->deprecated ^ 0xff;
      }
    }
    if ((local_79 != false) || ((local_7a & 1) != 0)) {
      if ((int)prev_val != 0) {
        AddComma(this);
      }
      AddNewLine(this);
      AddIndent(this,it._M_current._4_4_);
      OutputIdentifier(this,(string *)fd_00);
      if (((this->opts->protobuf_ascii_alike & 1U) == 0) ||
         (((fd_00->value).type.base_type != BASE_TYPE_STRUCT &&
          ((fd_00->value).type.base_type != BASE_TYPE_VECTOR)))) {
        std::__cxx11::string::operator+=((string *)this->text,':');
      }
      std::__cxx11::string::operator+=((string *)this->text,' ');
      switch((fd_00->value).type.base_type) {
      case BASE_TYPE_NONE:
        GenField<unsigned_char>(this,fd_00,table,(bool)(struct_def->fixed & 1),it._M_current._4_4_);
        break;
      case BASE_TYPE_UTYPE:
        GenField<unsigned_char>(this,fd_00,table,(bool)(struct_def->fixed & 1),it._M_current._4_4_);
        break;
      case BASE_TYPE_BOOL:
        GenField<unsigned_char>(this,fd_00,table,(bool)(struct_def->fixed & 1),it._M_current._4_4_);
        break;
      case BASE_TYPE_CHAR:
        GenField<signed_char>(this,fd_00,table,(bool)(struct_def->fixed & 1),it._M_current._4_4_);
        break;
      case BASE_TYPE_UCHAR:
        GenField<unsigned_char>(this,fd_00,table,(bool)(struct_def->fixed & 1),it._M_current._4_4_);
        break;
      case BASE_TYPE_SHORT:
        GenField<short>(this,fd_00,table,(bool)(struct_def->fixed & 1),it._M_current._4_4_);
        break;
      case BASE_TYPE_USHORT:
        GenField<unsigned_short>(this,fd_00,table,(bool)(struct_def->fixed & 1),it._M_current._4_4_)
        ;
        break;
      case BASE_TYPE_INT:
        GenField<int>(this,fd_00,table,(bool)(struct_def->fixed & 1),it._M_current._4_4_);
        break;
      case BASE_TYPE_UINT:
        GenField<unsigned_int>(this,fd_00,table,(bool)(struct_def->fixed & 1),it._M_current._4_4_);
        break;
      case BASE_TYPE_LONG:
        GenField<long>(this,fd_00,table,(bool)(struct_def->fixed & 1),it._M_current._4_4_);
        break;
      case BASE_TYPE_ULONG:
        GenField<unsigned_long>(this,fd_00,table,(bool)(struct_def->fixed & 1),it._M_current._4_4_);
        break;
      case BASE_TYPE_FLOAT:
        GenField<float>(this,fd_00,table,(bool)(struct_def->fixed & 1),it._M_current._4_4_);
        break;
      case BASE_TYPE_DOUBLE:
        GenField<double>(this,fd_00,table,(bool)(struct_def->fixed & 1),it._M_current._4_4_);
        break;
      case BASE_TYPE_STRING:
      case BASE_TYPE_VECTOR:
      case BASE_TYPE_STRUCT:
      case BASE_TYPE_UNION:
      case BASE_TYPE_ARRAY:
      case BASE_TYPE_VECTOR64:
        pcVar4 = GenFieldOffset(this,fd_00,table,(bool)(struct_def->fixed & 1),it._M_current._4_4_,
                                (uint8_t *)pTStack_38);
        if (pcVar4 != (char *)0x0) {
          return pcVar4;
        }
      }
      if ((struct_def->fixed & 1U) == 0) {
        pTStack_38 = (Table *)Table::GetAddressOf(table,(fd_00->value).offset);
        prev_val._0_4_ = (int)prev_val + 1;
      }
      else {
        pTStack_38 = table + (int)(uint)(fd_00->value).offset;
        prev_val._0_4_ = (int)prev_val + 1;
      }
    }
    __gnu_cxx::
    __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
    ::operator++(&local_48);
  } while( true );
}

Assistant:

const char *GenStruct(const StructDef &struct_def, const Table *table,
                        int indent) {
    text += '{';
    int fieldout = 0;
    const uint8_t *prev_val = nullptr;
    const auto elem_indent = indent + Indent();
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      FieldDef &fd = **it;
      auto is_present = struct_def.fixed || table->CheckField(fd.value.offset);
      auto output_anyway = (opts.output_default_scalars_in_json || fd.key) &&
                           IsScalar(fd.value.type.base_type) && !fd.deprecated;
      if (is_present || output_anyway) {
        if (fieldout++) { AddComma(); }
        AddNewLine();
        AddIndent(elem_indent);
        OutputIdentifier(fd.name);
        if (!opts.protobuf_ascii_alike ||
            (fd.value.type.base_type != BASE_TYPE_STRUCT &&
             fd.value.type.base_type != BASE_TYPE_VECTOR))
          text += ':';
        text += ' ';
        // clang-format off
        switch (fd.value.type.base_type) {
        #define FLATBUFFERS_TD(ENUM, IDLTYPE, CTYPE, ...) \
          case BASE_TYPE_ ## ENUM: { \
            GenField<CTYPE>(fd, table, struct_def.fixed, elem_indent); \
            break; }
            FLATBUFFERS_GEN_TYPES_SCALAR(FLATBUFFERS_TD)
        #undef FLATBUFFERS_TD
        // Generate drop-thru case statements for all pointer types:
        #define FLATBUFFERS_TD(ENUM, ...) \
          case BASE_TYPE_ ## ENUM:
              FLATBUFFERS_GEN_TYPES_POINTER(FLATBUFFERS_TD)
              FLATBUFFERS_GEN_TYPE_ARRAY(FLATBUFFERS_TD)
        #undef FLATBUFFERS_TD
            {
              auto err = GenFieldOffset(fd, table, struct_def.fixed, elem_indent, prev_val);
              if (err) return err;
              break;
            }
        }
        // clang-format on
        // Track prev val for use with union types.
        if (struct_def.fixed) {
          prev_val = reinterpret_cast<const uint8_t *>(table) + fd.value.offset;
        } else {
          prev_val = table->GetAddressOf(fd.value.offset);
        }
      }
    }
    AddNewLine();
    AddIndent(indent);
    text += '}';
    return nullptr;
  }